

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void gen_initializer(c2m_ctx_t c2m_ctx,size_t init_start,op_t var,char *global_name,mir_size_t size,
                    int param_6)

{
  int *piVar1;
  node_code_t nVar2;
  uint uVar3;
  gen_ctx_conflict *pgVar4;
  MIR_context_t ctx;
  expr_conflict *e;
  node_t_conflict pnVar5;
  undefined8 uVar6;
  MIR_context_t ctx_00;
  MIR_module_t module;
  ushort uVar7;
  op_t var_00;
  op_t oVar8;
  undefined1 auVar9 [64];
  undefined1 uVar10;
  undefined1 uVar11;
  undefined2 uVar12;
  undefined4 uVar13;
  undefined1 str [16];
  MIR_type_t MVar14;
  MIR_type_t MVar15;
  int iVar16;
  MIR_alias_t alias;
  size_t sVar17;
  op_t *desirable_dest;
  mir_size_t len;
  type *ptVar18;
  MIR_label_t label;
  DLIST_MIR_module_t *pDVar19;
  MIR_item_t_conflict pMVar20;
  ulong uVar21;
  long lVar22;
  type *ptVar23;
  type *type;
  ulong uVar24;
  decl_t pdVar25;
  type *ptVar26;
  decl_t pdVar27;
  bool bVar28;
  type *local_1f8;
  ulong local_1f0;
  MIR_item_t_conflict local_1b8;
  anon_union_16_12_e26b18bd u;
  type *ptStack_198;
  decl_t pdStack_190;
  type *ptStack_188;
  type *ptStack_180;
  node_t_conflict pnStack_178;
  undefined8 uStack_170;
  type *local_160;
  undefined1 local_158 [32];
  type *ptStack_138;
  type *ptStack_130;
  node_t_conflict pnStack_128;
  undefined8 uStack_120;
  type *local_118;
  ulong local_110;
  MIR_op_t mem;
  undefined1 local_d8 [16];
  anon_union_32_12_57d33f68_for_u aStack_c8;
  op_t res;
  init_el_t local_68;
  
  pgVar4 = c2m_ctx->gen_ctx;
  if (var.mir_op._8_1_ == '\x01') {
    if ((param_6 == 0) ||
       (sVar17 = VARR_init_el_tlength(pgVar4->init_els), sVar17 - init_start != 1)) {
      __assert_fail("local_p && offset == 0 && VARR_LENGTH (init_el_t, init_els) - init_start == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2e44,
                    "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)");
    }
    VARR_init_el_tget((init_el_t *)local_158,pgVar4->init_els,init_start);
    ptVar26 = ptStack_138;
    val_gen((op_t *)local_158,c2m_ctx,pnStack_128);
    MVar14 = get_op_type(c2m_ctx,var);
    MVar15 = get_mir_type(c2m_ctx,ptVar26);
    cast((op_t *)&u,c2m_ctx,_local_158,MVar15,0);
    emit_scalar_assign(c2m_ctx,var,(op_t *)local_158,MVar14,0);
  }
  else {
    ctx = c2m_ctx->ctx;
    local_118 = (type *)size;
    if (param_6 == 0) {
      if (var.mir_op._8_1_ != '\b') {
        __assert_fail("var.mir_op.mode == MIR_OP_REF",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2e72,
                      "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                     );
      }
      local_1f8 = (type *)0x0;
      local_1b8 = (MIR_item_t_conflict)0x0;
      for (local_1f0 = init_start; sVar17 = VARR_init_el_tlength(pgVar4->init_els),
          local_1f0 < sVar17; local_1f0 = local_1f0 + 1) {
        VARR_init_el_tget((init_el_t *)&u,pgVar4->init_els,local_1f0);
        pnVar5 = pnStack_178;
        ptVar18 = ptStack_188;
        pdVar27 = pdStack_190;
        ptVar26 = ptStack_198;
        if (((local_1f0 == init_start) ||
            (VARR_init_el_tget(&local_68,pgVar4->init_els,local_1f0 - 1),
            ptVar26 != (type *)local_68.offset)) ||
           ((pdVar27 != (decl_t)0x0 && (-1 < pdVar27->bit_offset)))) {
          e = (expr_conflict *)pnVar5->attr;
          if ((undefined1  [64])((undefined1  [64])*e & (undefined1  [64])0x2) ==
              (undefined1  [64])0x0) {
            if ((undefined1  [64])((undefined1  [64])*e & (undefined1  [64])0x1) !=
                (undefined1  [64])0x0) {
              convert_value(e,ptVar18);
              e->type = ptVar18;
            }
            val_gen((op_t *)local_158,c2m_ctx,pnVar5);
            if (6 < (ushort)(local_158[0x18] - 3)) {
              __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT || val.mir_op.mode == MIR_OP_FLOAT || val.mir_op.mode == MIR_OP_DOUBLE || val.mir_op.mode == MIR_OP_LDOUBLE || val.mir_op.mode == MIR_OP_STR || val.mir_op.mode == MIR_OP_REF"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x2e82,
                            "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                           );
            }
          }
          if (local_1f8 <= ptVar26 && (long)ptVar26 - (long)local_1f8 != 0) {
            local_1b8 = MIR_new_bss(ctx,global_name,(long)ptVar26 - (long)local_1f8);
            if (global_name != (char *)0x0) {
              ((var.decl)->u).item = local_1b8;
            }
            global_name = (char *)0x0;
          }
          ptVar23 = local_160;
          MVar14 = get_mir_type(c2m_ctx,ptVar18);
          if ((undefined1  [64])((undefined1  [64])*e & (undefined1  [64])0x2) ==
              (undefined1  [64])0x0) {
            uVar12 = local_158._24_2_;
            if (local_158[0x18] == '\t') {
              if (ptVar18->mode != TM_ARR) {
                str = _ptStack_138;
                ctx_00 = c2m_ctx->ctx;
                pDVar19 = MIR_get_module_list(ctx_00);
                module = pDVar19->tail;
                _MIR_get_temp_item_name(ctx_00,module,&u.i8,0x32);
                pMVar20 = MIR_new_string_data(ctx_00,&u.i8,(MIR_str_t)str);
                move_item_to_module_start(module,pMVar20);
                local_1b8 = MIR_new_ref_data(ctx,global_name,pMVar20,0);
                goto LAB_001763d6;
              }
              local_1f8 = (type *)raw_type_size(c2m_ctx,ptVar18);
              ptVar18 = ptStack_138;
              ptVar23 = ptStack_130;
              if (local_1f8 < ptVar18) {
                local_1b8 = MIR_new_data(ctx,global_name,MIR_T_U8,(size_t)local_1f8,ptVar23);
              }
              else {
                local_1b8 = MIR_new_string_data(ctx,global_name,(MIR_str_t)_ptStack_138);
                if (ptVar18 <= local_1f8 && (long)local_1f8 - (long)ptVar18 != 0) {
                  MIR_new_bss(ctx,(char *)0x0,(long)local_1f8 - (long)ptVar18);
                }
              }
            }
            else if (local_158[0x18] == '\b') {
              local_1b8 = MIR_new_ref_data(ctx,global_name,(MIR_item_t_conflict)ptStack_138,0);
              local_1f8 = (type *)_MIR_type_size(ctx,MVar14);
            }
            else {
              ptVar18 = (type *)_MIR_type_size(ctx,MVar14);
              if ((pdVar27 != (decl_t)0x0) && (uVar3 = pdVar27->bit_offset, -1 < (int)uVar3)) {
                mem.data = (void *)0x0;
                if (1 < (ushort)((uVar12 & 0xff) - 3)) {
                  __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                ,0x2eb7,
                                "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                               );
                }
                if ((uVar3 & 7) != 0) {
                  __assert_fail("init_el.member_decl->bit_offset % 8 == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                ,0x2eb8,
                                "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                               );
                }
                local_110 = (ulong)(uVar3 >> 3);
                do {
                  add_bit_field(c2m_ctx,(uint64_t *)&mem,(uint64_t)ptStack_138,pdVar27);
                  uVar21 = local_1f0;
                  pdVar25 = pdVar27;
                  do {
                    local_1f0 = uVar21 + 1;
                    sVar17 = VARR_init_el_tlength(pgVar4->init_els);
                    if ((sVar17 <= local_1f0) ||
                       (VARR_init_el_tget((init_el_t *)&u,pgVar4->init_els,local_1f0),
                       pdVar27 = pdStack_190, ptVar23 = ptStack_198, ptStack_198 != ptVar26)) {
                      ptStack_138 = (type *)mem.data;
                      sVar17 = VARR_init_el_tlength(pgVar4->init_els);
                      local_1f8 = (type *)((long)ptVar23 - (long)ptVar26);
                      if (ptVar18 <= (type *)((long)ptVar23 - (long)ptVar26)) {
                        local_1f8 = ptVar18;
                      }
                      bVar28 = sVar17 <= local_1f0;
                      uVar24 = local_110;
                      local_1f0 = uVar21;
                      local_160 = ptVar23;
                      if (bVar28) {
                        local_1f8 = ptVar18;
                      }
                      goto LAB_00176442;
                    }
                    piVar1 = &pdVar25->bit_offset;
                    uVar21 = local_1f0;
                    ptVar23 = ptVar26;
                    pdVar25 = pdStack_190;
                  } while (pdStack_190->bit_offset == *piVar1);
                  val_gen((op_t *)&u,c2m_ctx,pnStack_178);
                  oVar8.decl._1_1_ = u.data[1];
                  oVar8.decl._0_1_ = u.i8;
                  oVar8.decl._2_2_ = u.i32._2_2_;
                  oVar8.decl._4_4_ = u.i64._4_4_;
                  oVar8._8_2_ = u._8_2_;
                  oVar8._10_6_ = u._10_6_;
                  oVar8.mir_op.data = ptStack_198;
                  oVar8.mir_op._8_8_ = pdStack_190;
                  oVar8.mir_op.u.i = (int64_t)ptStack_188;
                  oVar8.mir_op.u.str.s = (char *)ptStack_180;
                  oVar8.mir_op.u._16_8_ = pnStack_178;
                  oVar8.mir_op.u.mem.disp = uStack_170;
                  local_158[0x18] = (byte)pdStack_190;
                  uVar7 = (ushort)local_158[0x18];
                  _local_158 = oVar8;
                  if (1 < (ushort)(uVar7 - 3)) {
                    __assert_fail("val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                  ,0x2ec0,
                                  "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                                 );
                  }
                } while( true );
              }
              uVar24 = 0;
              local_1f8 = ptVar18;
LAB_00176442:
              uVar13 = u.i64._4_4_;
              uVar12 = u.i32._2_2_;
              uVar11 = u.data[1];
              uVar10 = u.i8;
              u.i8 = local_158[0x20];
              u.data[1] = local_158[0x21];
              u.i32._2_2_ = local_158._34_2_;
              u.i64._4_4_ = local_158._36_4_;
              switch(MVar14) {
              case MIR_T_I8:
              case MIR_T_U8:
                u.data[1] = uVar11;
                u.i32._2_2_ = uVar12;
                u.i64._4_4_ = uVar13;
                break;
              case MIR_T_I16:
              case MIR_T_U16:
                u.i32._2_2_ = uVar12;
                u.i64._4_4_ = uVar13;
                break;
              case MIR_T_I32:
              case MIR_T_U32:
                u.i64._4_4_ = uVar13;
                break;
              case MIR_T_I64:
              case MIR_T_U64:
                break;
              case MIR_T_F:
                u.i64._4_4_ = uVar13;
                break;
              case MIR_T_D:
                break;
              case MIR_T_LD:
                u._8_2_ = local_158._40_2_;
                break;
              default:
                u.i8 = uVar10;
                u.data[1] = uVar11;
                u.i32._2_2_ = uVar12;
                u.i64._4_4_ = uVar13;
                __assert_fail("FALSE",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2ed4,
                              "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                             );
              }
              if ((uVar24 == 0) && (local_1f8 == ptVar18)) {
                local_1b8 = MIR_new_data(ctx,global_name,MVar14,1,&u);
              }
              else {
                for (lVar22 = 0; (type *)(uVar24 + lVar22) < local_1f8; lVar22 = lVar22 + 1) {
                  if (lVar22 == 0) {
                    local_1b8 = MIR_new_data(ctx,global_name,MIR_T_U8,1,u.data + uVar24);
                  }
                  else {
                    MIR_new_data(ctx,(char *)0x0,MIR_T_U8,1,u.data + uVar24 + lVar22);
                  }
                }
              }
            }
          }
          else {
            pnVar5 = e->def_node;
            if (pnVar5 == (node_t_conflict)0x0) {
              uVar6 = *(undefined8 *)&e->c;
              u.i8 = (int8_t)uVar6;
              u.data[1] = (uint8_t)((ulong)uVar6 >> 8);
              u.i32._2_2_ = (undefined2)((ulong)uVar6 >> 0x10);
              u.i64._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
              MVar14 = MIR_T_P;
              local_1b8 = MIR_new_data(ctx,global_name,MIR_T_P,1,&u);
LAB_001763d6:
              local_1f8 = (type *)_MIR_type_size(ctx,MVar14);
            }
            else {
              if (pnVar5->code - N_STR < 3) {
                pMVar20 = get_string_data(c2m_ctx,pnVar5);
LAB_0017647d:
                local_1b8 = MIR_new_ref_data(ctx,global_name,pMVar20,(e->c).i_val);
              }
              else {
                if (pnVar5->code != N_LABEL_ADDR) {
                  pMVar20 = *(MIR_item_t_conflict *)((long)pnVar5->attr + 0x50);
                  goto LAB_0017647d;
                }
                label = get_label(c2m_ctx,*(node_t_conflict *)((long)pnVar5->attr + 8));
                local_1b8 = MIR_new_lref_data(ctx,global_name,label,(MIR_label_t)0x0,(e->c).i_val);
              }
              local_1f8 = (type *)_MIR_type_size(ctx,MVar14);
            }
          }
          if (global_name != (char *)0x0) {
            ((var.decl)->u).item = local_1b8;
          }
          global_name = (char *)0x0;
          local_1f8 = (type *)((long)&ptVar26->pos_node + (long)&local_1f8->pos_node);
        }
      }
      if ((local_1f8 <= (type *)((long)local_118 - 1U)) &&
         (pMVar20 = MIR_new_bss(ctx,global_name,(long)local_118 - (long)local_1f8),
         global_name != (char *)0x0)) {
        ((var.decl)->u).item = pMVar20;
      }
    }
    else {
      if ((var.mir_op._8_1_ != '\n') || (var.mir_op.u.mem.index != 0)) {
        __assert_fail("var.mir_op.mode == MIR_OP_MEM && var.mir_op.u.mem.index == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2e4b,
                      "void gen_initializer(c2m_ctx_t, size_t, op_t, const char *, mir_size_t, int)"
                     );
      }
      lVar22 = 0;
      ptVar26 = (type *)0x0;
      while( true ) {
        sVar17 = VARR_init_el_tlength(pgVar4->init_els);
        if (sVar17 <= init_start + lVar22) break;
        VARR_init_el_tget((init_el_t *)&u,pgVar4->init_els,init_start + lVar22);
        pnVar5 = pnStack_178;
        ptVar23 = ptStack_188;
        pdVar27 = pdStack_190;
        ptVar18 = ptStack_198;
        local_160 = ptStack_180;
        MVar14 = get_mir_type(c2m_ctx,ptStack_188);
        if (ptVar26 <= ptVar18 && (long)ptVar18 - (long)ptVar26 != 0) {
          gen_memset(c2m_ctx,(long)&ptVar26->pos_node + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,
                     (long)ptVar18 - (long)ptVar26);
          ptVar26 = ptVar18;
        }
        if (MVar14 == MIR_T_UNDEF) {
          MIR_new_mem_op((MIR_op_t *)local_d8,ctx,MIR_T_UNDEF,
                         (long)&ptVar26->pos_node + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,0,
                         '\x01');
          local_158 = local_158._8_32_ << 0x40;
          ptStack_180 = (type *)aStack_c8._16_8_;
          pnStack_178 = (node_t_conflict)aStack_c8.mem.disp;
          u._8_2_ = (undefined2)local_d8._0_8_;
          u._10_6_ = SUB86(local_d8._0_8_,2);
          ptStack_198 = (type *)local_d8._8_8_;
          pdStack_190 = (decl_t)aStack_c8.i;
          ptStack_188 = (type *)aStack_c8.str.s;
          auVar9[1] = u.data[1];
          auVar9[0] = u.i8;
          auVar9._2_2_ = u.i32._2_2_;
          auVar9._4_4_ = u.i64._4_4_;
          ptStack_138 = (type *)aStack_c8.i;
          ptStack_130 = (type *)aStack_c8.str.s;
          pnStack_128 = (node_t_conflict)aStack_c8._16_8_;
          uStack_120 = aStack_c8.mem.disp;
          auVar9._8_8_ = local_d8._0_8_;
          auVar9._16_8_ = local_d8._8_8_;
          auVar9._24_8_ = aStack_c8.i;
          auVar9._32_24_ = _ptStack_130;
          auVar9._56_8_ = 0;
          _local_158 = (op_t)(auVar9 << 0x40);
        }
        desirable_dest = (op_t *)local_158;
        if (MVar14 != MIR_T_UNDEF) {
          desirable_dest = (op_t *)0x0;
        }
        gen((op_t *)&u,c2m_ctx,pnVar5,(MIR_label_t)0x0,(MIR_label_t)0x0,
            (uint)(MVar14 != MIR_T_UNDEF),desirable_dest,(int *)0x0);
        local_158[1] = u.data[1];
        local_158[0] = u.i8;
        local_158._2_2_ = u.i32._2_2_;
        local_158._4_4_ = u.i64._4_4_;
        local_158._10_6_ = u._10_6_;
        local_158._8_2_ = u._8_2_;
        local_158._16_8_ = ptStack_198;
        local_158._24_8_ = pdStack_190;
        ptStack_138 = ptStack_188;
        ptStack_130 = ptStack_180;
        pnStack_128 = pnStack_178;
        uStack_120 = uStack_170;
        iVar16 = scalar_type_p(ptVar23);
        if (iVar16 == 0) {
          nVar2 = pnVar5->code;
          if (nVar2 == N_STR32) {
            len = (pnVar5->u).s.len >> 2;
          }
          else if (nVar2 == N_STR16) {
            len = (pnVar5->u).s.len >> 1;
          }
          else if (nVar2 == N_STR) {
            len = (pnVar5->u).s.len;
          }
          else {
            len = raw_type_size(c2m_ctx,ptVar23);
          }
          gen_memcpy(c2m_ctx,(long)&ptVar26->pos_node + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,
                     _local_158,len);
        }
        else {
          if ((local_160 == (type *)0x0) || (type = local_160, local_160->mode != TM_UNION)) {
            type = ptVar23;
          }
          alias = get_type_alias(c2m_ctx,type);
          MIR_new_alias_mem_op
                    (&mem,ctx,MVar14,(long)&ptVar18->pos_node + var.mir_op.u.mem.disp,
                     var.mir_op.u.mem.base,0,'\x01',alias,0);
          MVar15 = get_mir_type(c2m_ctx,ptVar23);
          cast((op_t *)&u,c2m_ctx,_local_158,MVar15,0);
          local_158[1] = u.data[1];
          local_158[0] = u.i8;
          local_158._2_2_ = u.i32._2_2_;
          local_158._4_4_ = u.i64._4_4_;
          local_158._10_6_ = u._10_6_;
          local_158._8_2_ = u._8_2_;
          res.mir_op.u._16_8_ = mem.u._16_8_;
          res.mir_op.u.mem.disp = mem.u.mem.disp;
          res.mir_op.data = mem.data;
          res.mir_op._8_8_ = mem._8_8_;
          res.mir_op.u.i = mem.u.i;
          res.mir_op.u.str.s = mem.u.str.s;
          local_158._16_8_ = ptStack_198;
          local_158._24_8_ = pdStack_190;
          ptStack_138 = ptStack_188;
          ptStack_130 = ptStack_180;
          pnStack_128 = pnStack_178;
          uStack_120 = uStack_170;
          res.decl = pdVar27;
          var_00._8_4_ = res._8_4_;
          var_00.decl = pdVar27;
          var_00._12_4_ = res._12_4_;
          var_00.mir_op.data._0_4_ = (int)mem.data;
          var_00.mir_op.data._4_4_ = (int)((ulong)mem.data >> 0x20);
          var_00.mir_op._8_8_ = mem._8_8_;
          var_00.mir_op.u.i = mem.u.i;
          var_00.mir_op.u.str.s = mem.u.str.s;
          var_00.mir_op.u._16_8_ = mem.u._16_8_;
          var_00.mir_op.u.mem.disp = mem.u.mem.disp;
          emit_scalar_assign(c2m_ctx,var_00,(op_t *)local_158,MVar14,
                             (uint)(ptVar26 == ptVar18 || lVar22 == 0));
          len = _MIR_type_size(ctx,MVar14);
        }
        ptVar26 = (type *)((long)&ptVar18->pos_node + len);
        lVar22 = lVar22 + 1;
      }
      if (ptVar26 <= local_118 && (long)local_118 - (long)ptVar26 != 0) {
        gen_memset(c2m_ctx,(long)&ptVar26->pos_node + var.mir_op.u.mem.disp,var.mir_op.u.mem.base,
                   (long)local_118 - (long)ptVar26);
      }
    }
  }
  return;
}

Assistant:

static void gen_initializer (c2m_ctx_t c2m_ctx, size_t init_start, op_t var,
                             const char *global_name, mir_size_t size, int local_p) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t val;
  size_t str_len;
  mir_size_t data_size, el_size, offset = 0, rel_offset = 0, start_offset;
  init_el_t init_el, next_init_el;
  MIR_reg_t base;
  MIR_type_t t;
  MIR_item_t data = NULL; /* to remove a warning */
  struct expr *e;

  if (var.mir_op.mode == MIR_OP_REG) { /* scalar initialization: */
    assert (local_p && offset == 0 && VARR_LENGTH (init_el_t, init_els) - init_start == 1);
    init_el = VARR_GET (init_el_t, init_els, init_start);
    val = val_gen (c2m_ctx, init_el.init);
    t = get_op_type (c2m_ctx, var);
    val = cast (c2m_ctx, val, get_mir_type (c2m_ctx, init_el.el_type), FALSE);
    emit_scalar_assign (c2m_ctx, var, &val, t, FALSE);
  } else if (local_p) { /* local variable initialization: */
    assert (var.mir_op.mode == MIR_OP_MEM && var.mir_op.u.mem.index == 0); /*???*/
    offset = var.mir_op.u.mem.disp;
    base = var.mir_op.u.mem.base;
    for (size_t i = init_start; i < VARR_LENGTH (init_el_t, init_els); i++) {
      init_el = VARR_GET (init_el_t, init_els, i);
      t = get_mir_type (c2m_ctx, init_el.el_type);
      if (rel_offset < init_el.offset) { /* fill the gap: */
        gen_memset (c2m_ctx, offset + rel_offset, base, init_el.offset - rel_offset);
        rel_offset = init_el.offset;
      }
      if (t == MIR_T_UNDEF)
        val = new_op (NULL, MIR_new_mem_op (ctx, t, offset + rel_offset, base, 0, 1));
      val = gen (c2m_ctx, init_el.init, NULL, NULL, t != MIR_T_UNDEF,
                 t != MIR_T_UNDEF ? NULL : &val, NULL);
      if (!scalar_type_p (init_el.el_type)) {
        mir_size_t s = init_el.init->code == N_STR     ? init_el.init->u.s.len
                       : init_el.init->code == N_STR16 ? init_el.init->u.s.len / 2
                       : init_el.init->code == N_STR32 ? init_el.init->u.s.len / 4
                                                       : raw_type_size (c2m_ctx, init_el.el_type);
        gen_memcpy (c2m_ctx, offset + rel_offset, base, val, s);
        rel_offset = init_el.offset + s;
      } else {
        MIR_op_t mem
          = MIR_new_alias_mem_op (ctx, t, offset + init_el.offset, base, 0, 1,
                                  get_type_alias (c2m_ctx,
                                                  init_el.container_type != NULL
                                                      && init_el.container_type->mode == TM_UNION
                                                    ? init_el.container_type
                                                    : init_el.el_type),
                                  0);
        val = cast (c2m_ctx, val, get_mir_type (c2m_ctx, init_el.el_type), FALSE);
        emit_scalar_assign (c2m_ctx, new_op (init_el.member_decl, mem), &val, t,
                            i == init_start || rel_offset == init_el.offset);
        rel_offset = init_el.offset + _MIR_type_size (ctx, t);
      }
    }
    if (rel_offset < size) /* fill the tail: */
      gen_memset (c2m_ctx, offset + rel_offset, base, size - rel_offset);
  } else {
    assert (var.mir_op.mode == MIR_OP_REF);
    for (size_t i = init_start; i < VARR_LENGTH (init_el_t, init_els); i++) {
      init_el = VARR_GET (init_el_t, init_els, i);
      if (i != init_start && init_el.offset == VARR_GET (init_el_t, init_els, i - 1).offset
          && (init_el.member_decl == NULL || init_el.member_decl->bit_offset < 0))
        continue;
      e = init_el.init->attr;
      if (!e->const_addr_p) {
        if (e->const_p) {
          convert_value (e, init_el.el_type);
          e->type = init_el.el_type; /* to get the right value in the subsequent gen call */
        }
        val = val_gen (c2m_ctx, init_el.init);
        assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT
                || val.mir_op.mode == MIR_OP_FLOAT || val.mir_op.mode == MIR_OP_DOUBLE
                || val.mir_op.mode == MIR_OP_LDOUBLE || val.mir_op.mode == MIR_OP_STR
                || val.mir_op.mode == MIR_OP_REF);
      }
      if (rel_offset < init_el.offset) { /* fill the gap: */
        data = MIR_new_bss (ctx, global_name, init_el.offset - rel_offset);
        if (global_name != NULL) var.decl->u.item = data;
        global_name = NULL;
      }
      t = get_mir_type (c2m_ctx, init_el.el_type);
      if (e->const_addr_p) {
        node_t def;

        if ((def = e->def_node) == NULL) { /* constant address */
          mir_size_t s = e->c.i_val;
          data = MIR_new_data (ctx, global_name, MIR_T_P, 1, &s);
          data_size = _MIR_type_size (ctx, MIR_T_P);
        } else if (def->code == N_LABEL_ADDR) {
          data = MIR_new_lref_data (ctx, global_name,
                                    get_label (c2m_ctx,
                                               ((struct expr *) def->attr)->u.label_addr_target),
                                    NULL, e->c.i_val);
          data_size = _MIR_type_size (ctx, t);
        } else {
          if (def->code != N_STR && def->code != N_STR16 && def->code != N_STR32) {
            data = ((decl_t) def->attr)->u.item;
          } else {
            data = get_string_data (c2m_ctx, def);
          }
          data = MIR_new_ref_data (ctx, global_name, data, e->c.i_val);
          data_size = _MIR_type_size (ctx, t);
        }
      } else if (val.mir_op.mode == MIR_OP_REF) {
        data = MIR_new_ref_data (ctx, global_name, val.mir_op.u.ref, 0);
        data_size = _MIR_type_size (ctx, t);
      } else if (val.mir_op.mode != MIR_OP_STR) {
        union {
          int8_t i8;
          uint8_t u8;
          int16_t i16;
          uint16_t u16;
          int32_t i32;
          uint32_t u32;
          int64_t i64;
          uint64_t u64;
          float f;
          double d;
          long double ld;
          uint8_t data[8];
        } u;
        start_offset = 0;
        el_size = data_size = _MIR_type_size (ctx, t);
        if (init_el.member_decl != NULL && init_el.member_decl->bit_offset >= 0) {
          uint64_t uval = 0;

          assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT);
          assert (init_el.member_decl->bit_offset % 8 == 0); /* first in the group of bitfields */
          start_offset = init_el.member_decl->bit_offset / 8;
          add_bit_field (c2m_ctx, &uval, val.mir_op.u.u, init_el.member_decl);
          for (; i + 1 < VARR_LENGTH (init_el_t, init_els); i++, init_el = next_init_el) {
            next_init_el = VARR_GET (init_el_t, init_els, i + 1);
            if (next_init_el.offset != init_el.offset) break;
            if (next_init_el.member_decl->bit_offset == init_el.member_decl->bit_offset) continue;
            val = val_gen (c2m_ctx, next_init_el.init);
            assert (val.mir_op.mode == MIR_OP_INT || val.mir_op.mode == MIR_OP_UINT);
            add_bit_field (c2m_ctx, &uval, val.mir_op.u.u, next_init_el.member_decl);
          }
          val.mir_op.u.u = uval;
          if (i + 1 < VARR_LENGTH (init_el_t, init_els)
              && next_init_el.offset - init_el.offset < data_size)
            data_size = next_init_el.offset - init_el.offset;
        }
        switch (t) {
        case MIR_T_I8: u.i8 = (int8_t) val.mir_op.u.i; break;
        case MIR_T_U8: u.u8 = (uint8_t) val.mir_op.u.u; break;
        case MIR_T_I16: u.i16 = (int16_t) val.mir_op.u.i; break;
        case MIR_T_U16: u.u16 = (uint16_t) val.mir_op.u.u; break;
        case MIR_T_I32: u.i32 = (int32_t) val.mir_op.u.i; break;
        case MIR_T_U32: u.u32 = (uint32_t) val.mir_op.u.u; break;
        case MIR_T_I64: u.i64 = val.mir_op.u.i; break;
        case MIR_T_U64: u.u64 = val.mir_op.u.u; break;
        case MIR_T_F: u.f = val.mir_op.u.f; break;
        case MIR_T_D: u.d = val.mir_op.u.d; break;
        case MIR_T_LD: u.ld = val.mir_op.u.ld; break;
        default: assert (FALSE);
        }
        if (start_offset == 0 && data_size == el_size) {
          data = MIR_new_data (ctx, global_name, t, 1, &u);
        } else {
          for (mir_size_t byte_num = start_offset; byte_num < data_size; byte_num++) {
            if (byte_num == start_offset)
              data = MIR_new_data (ctx, global_name, MIR_T_U8, 1, &u.data[byte_num]);
            else
              MIR_new_data (ctx, NULL, MIR_T_U8, 1, &u.data[byte_num]);
          }
        }
      } else if (init_el.el_type->mode == TM_ARR) {
        data_size = raw_type_size (c2m_ctx, init_el.el_type);
        str_len = val.mir_op.u.str.len;
        if (data_size < str_len) {
          data = MIR_new_data (ctx, global_name, MIR_T_U8, data_size, val.mir_op.u.str.s);
        } else {
          data = MIR_new_string_data (ctx, global_name, val.mir_op.u.str);
          if (data_size > str_len) MIR_new_bss (ctx, NULL, data_size - str_len);
        }
      } else {
        data = get_mir_str_op_data (c2m_ctx, val.mir_op.u.str);
        data = MIR_new_ref_data (ctx, global_name, data, 0);
        data_size = _MIR_type_size (ctx, t);
      }
      if (global_name != NULL) var.decl->u.item = data;
      global_name = NULL;
      rel_offset = init_el.offset + data_size;
    }
    if (rel_offset < size || size == 0) { /* fill the tail: */
      data = MIR_new_bss (ctx, global_name, size - rel_offset);
      if (global_name != NULL) var.decl->u.item = data;
    }
  }
}